

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
* __thiscall
mjs::parser::parse_function_abi_cxx11_
          (tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
           *__return_storage_ptr__,parser *this)

{
  bool bVar1;
  undefined4 uVar2;
  pointer psVar3;
  token_type tVar4;
  bool bVar5;
  int iVar6;
  wstring *__x;
  __normal_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  _Var7;
  wostream *pwVar8;
  char *pcVar9;
  wchar_t *extraout_RDX;
  wstring_view *s;
  version vVar10;
  ulong uVar11;
  wchar_t *in_R9;
  long lVar12;
  wstring_view name;
  wstring_view message;
  wstring_view message_00;
  undefined1 local_298 [16];
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  params;
  wstring local_268;
  vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> param_extends;
  value_type n;
  mjs local_208 [16];
  token local_1f8;
  wostringstream _oss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8 [46];
  token local_58;
  
  local_298._12_4_ = (undefined4)(this->lexer_).text_pos_;
  pcVar9 = "parse_function";
  expect(&local_58,this,lparen,"parse_function",0x288);
  token::destroy(&local_58);
  params.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  params.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  params.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  param_extends.super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  param_extends.super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  param_extends.super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  accept((parser *)&_oss,(int)this,(sockaddr *)0x2f,(socklen_t *)pcVar9);
  tVar4 = __oss;
  token::destroy((token *)&_oss);
  if (tVar4 == eof) {
    do {
      current_extend((source_extend *)&_oss,this);
      std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::
      emplace_back<mjs::source_extend>(&param_extends,(source_extend *)&_oss);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1c8);
      pcVar9 = "parse_function";
      expect((token *)&_oss,this,identifier,"parse_function",0x28e);
      __x = token::text_abi_cxx11_((token *)&_oss);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::push_back(&params,__x);
      token::destroy((token *)&_oss);
      accept((parser *)&_oss,(int)this,(sockaddr *)0x20,(socklen_t *)pcVar9);
      tVar4 = __oss;
      token::destroy((token *)&_oss);
    } while (tVar4 != eof);
    expect(&local_1f8,this,rparen,"parse_function",0x290);
    token::destroy(&local_1f8);
  }
  bVar1 = this->strict_mode_;
  parse_block((parser *)local_298,SUB81(this,0));
  uVar2 = *(undefined4 *)(local_298._0_8_ + 0x1c);
  iVar6 = (**(code **)(*(long *)local_298._0_8_ + 0x18))();
  if (iVar6 != 0) {
    __assert_fail("block->type() == statement_type::block",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x296,"auto mjs::parser::parse_function()");
  }
  if ((*(char *)(local_298._0_8_ + 0x38) == '\x01') &&
     (this->skip_strict_checks_for_first_function_ == false)) {
    lVar12 = 0x20;
    iVar6 = 0;
    for (uVar11 = 0;
        uVar11 < (ulong)((long)params.
                               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)params.
                               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar11 = uVar11 + 1)
    {
      std::__cxx11::wstring::wstring
                ((wstring *)&n,
                 (wstring *)
                 ((long)&params.
                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p + lVar12));
      name._M_str = extraout_RDX;
      name._M_len = (size_t)n._M_dataplus._M_p;
      bVar5 = is_strict_mode_unassignable_identifier((mjs *)n._M_string_length,name);
      if (bVar5) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&_oss);
        pwVar8 = std::operator<<((wostream *)&_oss,"\"");
        local_208[0] = (mjs)(undefined1)n._M_string_length;
        local_208[1] = (mjs)n._M_string_length._1_1_;
        local_208[2] = (mjs)n._M_string_length._2_1_;
        local_208[3] = (mjs)n._M_string_length._3_1_;
        local_208[4] = (mjs)n._M_string_length._4_1_;
        local_208[5] = (mjs)n._M_string_length._5_1_;
        local_208[6] = (mjs)n._M_string_length._6_1_;
        local_208[7] = (mjs)n._M_string_length._7_1_;
        local_208._8_8_ = n._M_dataplus._M_p;
        cpp_quote_abi_cxx11_(&local_268,local_208,s);
        pwVar8 = std::operator<<(pwVar8,(wstring *)&local_268);
        std::operator<<(pwVar8,"\" may not be used as a parameter name in strict mode");
        std::__cxx11::wstring::~wstring((wstring *)&local_268);
        psVar3 = param_extends.
                 super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl
                 .super__Vector_impl_data._M_start;
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = (size_t)local_268._M_dataplus._M_p;
        syntax_error((parser *)"parse_function",(char *)0x29b,(int)psVar3 + iVar6,
                     (source_extend *)local_268._M_string_length,message);
      }
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::wstring*,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::wstring_const>>
                        ((long)&((params.
                                  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar12,params.
                                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&n);
      if (_Var7._M_current !=
          params.
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&_oss);
        std::operator<<((wostream *)&_oss,"Parameter names may not be repeated in strict mode");
        psVar3 = param_extends.
                 super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl
                 .super__Vector_impl_data._M_start;
        std::__cxx11::wstringbuf::str();
        message_00._M_str = in_R9;
        message_00._M_len = (size_t)local_268._M_dataplus._M_p;
        syntax_error((parser *)"parse_function",(char *)0x29e,(int)psVar3 + iVar6,
                     (source_extend *)local_268._M_string_length,message_00);
      }
      std::__cxx11::wstring::~wstring((wstring *)&n);
      iVar6 = iVar6 + 0x18;
      lVar12 = lVar12 + 0x20;
    }
  }
  vVar10 = local_298._12_4_ - es3;
  this->skip_strict_checks_for_first_function_ = false;
  std::__shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> *)&_oss,
             (__shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_1c8[1]._M_pi._0_4_ = vVar10;
  local_1c8[1]._M_pi._4_4_ = uVar2;
  std::
  tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
  ::
  tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_true,_true>
            (__return_storage_ptr__,(source_extend *)&_oss,&params,
             (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_298);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1c8);
  if ((element_type *)local_298._0_8_ != (element_type *)0x0) {
    (*((syntax_node *)local_298._0_8_)->_vptr_syntax_node[1])();
  }
  this->strict_mode_ = bVar1;
  std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::~vector(&param_extends);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&params);
  return __return_storage_ptr__;
}

Assistant:

auto parse_function() {
        const auto body_start = lexer_.text_position() - 1;
        EXPECT(token_type::lparen);
        std::vector<std::wstring> params;
        std::vector<source_extend> param_extends;
        if (!accept(token_type::rparen)) {
            do {
                param_extends.push_back(current_extend());
                params.push_back(EXPECT(token_type::identifier).text());
            } while (accept(token_type::comma));
            EXPECT(token_type::rparen);
        }
        scoped_strict_mode ssm{*this};   // Make sure state is restored afterwards
        auto block = parse_block(version_ >= version::es5);
        const auto body_end = block->extend().end;

        assert(block->type() == statement_type::block);
        if (static_cast<const block_statement&>(*block).strict_mode() && !skip_strict_checks_for_first_function_) {
            for (size_t i = 0; i < params.size(); ++i) {
                auto n = params[i];
                if (is_strict_mode_unassignable_identifier(n)) {
                    SYNTAX_ERROR_AT("\"" << cpp_quote(n) << "\" may not be used as a parameter name in strict mode", param_extends[i]);
                }
                if (std::find(params.begin() + i + 1, params.end(), n) != params.end()) {
                    SYNTAX_ERROR_AT("Parameter names may not be repeated in strict mode", param_extends[i]);
                }
            }
        }
        skip_strict_checks_for_first_function_ = false;

        return std::make_tuple(source_extend{source_, body_start, body_end}, std::move(params), std::move(block));
    }